

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

char * basename(char *__filename)

{
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  *(char **)__filename = __filename + 0x10;
  __filename[8] = '\0';
  __filename[9] = '\0';
  __filename[10] = '\0';
  __filename[0xb] = '\0';
  __filename[0xc] = '\0';
  __filename[0xd] = '\0';
  __filename[0xe] = '\0';
  __filename[0xf] = '\0';
  __filename[0x10] = '\0';
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_last_of(in_RSI,"/\\",0xffffffffffffffff);
  if (sVar1 == 0xffffffffffffffff) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__filename,".");
  }
  else {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_last_of(in_RSI,"/\\",0xffffffffffffffff);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_30,in_RSI,0,sVar1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__filename,
               &local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__filename,"/");
  return __filename;
}

Assistant:

std::string basename(const std::string & filepath)
{
  std::string basedir;
  if (filepath.find_last_of("/\\") != std::string::npos) {
    basedir = filepath.substr(0, filepath.find_last_of("/\\"));
  } else {
    basedir = ".";
  }
#ifdef _WIN32
  basedir += "\\";
#else
  basedir += "/";
#endif
  return basedir;
}